

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMax
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pBVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  fpclass_type fVar5;
  int iVar6;
  int32_t *piVar7;
  pointer pBVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  int32_t iVar13;
  long in_FS_OFFSET;
  byte bVar14;
  cpp_dec_float<200U,_int,_void> local_3f8;
  int *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  cpp_dec_float<200U,_int,_void> local_368;
  int *local_2e0;
  cpp_dec_float<200U,_int,_void> local_2d8;
  cpp_dec_float<200U,_int,_void> local_258;
  cpp_dec_float<200U,_int,_void> local_1d8;
  cpp_dec_float<200U,_int,_void> local_158;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  double local_c8;
  undefined8 uStack_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar14 = 0;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x1c;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems[0xe] = 0;
  local_2d8.data._M_elems[0xf] = 0;
  local_2d8.data._M_elems[0x10] = 0;
  local_2d8.data._M_elems[0x11] = 0;
  local_2d8.data._M_elems[0x12] = 0;
  local_2d8.data._M_elems[0x13] = 0;
  local_2d8.data._M_elems[0x14] = 0;
  local_2d8.data._M_elems[0x15] = 0;
  local_2d8.data._M_elems[0x16] = 0;
  local_2d8.data._M_elems[0x17] = 0;
  local_2d8.data._M_elems[0x18] = 0;
  local_2d8.data._M_elems[0x19] = 0;
  local_2d8.data._M_elems._104_5_ = 0;
  local_2d8.data._M_elems[0x1b]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  local_378 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    piVar7 = &local_3f8.prec_elem;
    local_3f8.fpclass = cpp_dec_float_finite;
    local_3f8.prec_elem = 0x1c;
    local_3f8.data._M_elems[0] = 0;
    local_3f8.data._M_elems[1] = 0;
    local_3f8.data._M_elems[2] = 0;
    local_3f8.data._M_elems[3] = 0;
    local_3f8.data._M_elems[4] = 0;
    local_3f8.data._M_elems[5] = 0;
    local_3f8.data._M_elems[6] = 0;
    local_3f8.data._M_elems[7] = 0;
    local_3f8.data._M_elems[8] = 0;
    local_3f8.data._M_elems[9] = 0;
    local_3f8.data._M_elems[10] = 0;
    local_3f8.data._M_elems[0xb] = 0;
    local_3f8.data._M_elems[0xc] = 0;
    local_3f8.data._M_elems[0xd] = 0;
    local_3f8.data._M_elems[0xe] = 0;
    local_3f8.data._M_elems[0xf] = 0;
    local_3f8.data._M_elems[0x10] = 0;
    local_3f8.data._M_elems[0x11] = 0;
    local_3f8.data._M_elems[0x12] = 0;
    local_3f8.data._M_elems[0x13] = 0;
    local_3f8.data._M_elems[0x14] = 0;
    local_3f8.data._M_elems[0x15] = 0;
    local_3f8.data._M_elems[0x16] = 0;
    local_3f8.data._M_elems[0x17] = 0;
    local_3f8.data._M_elems[0x18] = 0;
    local_3f8.data._M_elems[0x19] = 0;
    local_3f8.data._M_elems._104_5_ = 0;
    local_3f8.data._M_elems[0x1b]._1_3_ = 0;
    local_3f8.exp = 0;
    local_3f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3f8,*(double *)(in_FS_OFFSET + -8));
  }
  else {
    iVar6 = *minIdx;
    pBVar1 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar8 = pBVar1 + iVar6;
    pcVar11 = &local_3f8;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pcVar11->data)._M_elems[0] = *(uint *)&(pBVar8->val).m_backend;
      pBVar8 = (pointer)((long)&(pBVar8->val).m_backend + 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((pcVar11->data)._M_elems + 1);
    }
    piVar7 = (int32_t *)((long)&pBVar1[iVar6].val.m_backend + 0x7c);
    local_3f8.exp = piVar7[-3];
    local_3f8.neg = *(bool *)(piVar7 + -2);
    local_3f8.fpclass = piVar7[-1];
  }
  iVar13 = *piVar7;
  pcVar11 = &local_3f8;
  pcVar10 = &local_b0;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pcVar10->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  local_b0.prec_elem = iVar13;
  local_b0.fpclass = local_3f8.fpclass;
  if (0 < nnz) {
    local_2e0 = idx + nnz;
    local_370 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).epsilon;
    local_c8 = *(double *)(in_FS_OFFSET + -8);
    local_d8 = SUB84(local_c8,0);
    v = &(this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).fastDelta;
    uStack_c0 = 0;
    uStack_d4 = (uint)((ulong)local_c8 >> 0x20) ^ 0x80000000;
    uStack_d0 = 0;
    uStack_cc = 0x80000000;
    local_b0.exp = local_3f8.exp;
    local_b0.neg = local_3f8.neg;
    do {
      iVar6 = *idx;
      pnVar9 = upd + iVar6;
      pcVar11 = &local_1d8;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
      }
      local_1d8.exp = upd[iVar6].m_backend.exp;
      local_1d8.neg = upd[iVar6].m_backend.neg;
      uVar2._0_4_ = upd[iVar6].m_backend.fpclass;
      uVar2._4_4_ = upd[iVar6].m_backend.prec_elem;
      pnVar9 = local_370;
      pcVar11 = &local_3f8;
      local_1d8._120_8_ = uVar2;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + (ulong)bVar14 * -8 + 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
      }
      local_3f8.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_3f8.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      fVar5 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon.m_backend.fpclass;
      iVar13 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.prec_elem;
      local_3f8.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_3f8.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (fVar5 == cpp_dec_float_NaN || (fpclass_type)uVar2 == cpp_dec_float_NaN) {
LAB_005c6bb2:
        pnVar9 = local_370;
        pcVar11 = &local_3f8;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + (ulong)bVar14 * -8 + 4);
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
        }
        local_3f8.prec_elem = iVar13;
        local_3f8.fpclass = fVar5;
        if (local_3f8.data._M_elems[0] != 0 || fVar5 != cpp_dec_float_finite) {
          local_3f8.neg = (bool)(local_3f8.neg ^ 1);
        }
        if (((fVar5 != cpp_dec_float_NaN) && (local_1d8.fpclass != cpp_dec_float_NaN)) &&
           (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_1d8,&local_3f8), iVar3 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar11 = &low[iVar6].m_backend;
          local_3f8.fpclass = cpp_dec_float_finite;
          local_3f8.prec_elem = 0x1c;
          local_3f8.data._M_elems[0] = 0;
          local_3f8.data._M_elems[1] = 0;
          local_3f8.data._M_elems[2] = 0;
          local_3f8.data._M_elems[3] = 0;
          local_3f8.data._M_elems[4] = 0;
          local_3f8.data._M_elems[5] = 0;
          local_3f8.data._M_elems[6] = 0;
          local_3f8.data._M_elems[7] = 0;
          local_3f8.data._M_elems[8] = 0;
          local_3f8.data._M_elems[9] = 0;
          local_3f8.data._M_elems[10] = 0;
          local_3f8.data._M_elems[0xb] = 0;
          local_3f8.data._M_elems[0xc] = 0;
          local_3f8.data._M_elems[0xd] = 0;
          local_3f8.data._M_elems[0xe] = 0;
          local_3f8.data._M_elems[0xf] = 0;
          local_3f8.data._M_elems[0x10] = 0;
          local_3f8.data._M_elems[0x11] = 0;
          local_3f8.data._M_elems[0x12] = 0;
          local_3f8.data._M_elems[0x13] = 0;
          local_3f8.data._M_elems[0x14] = 0;
          local_3f8.data._M_elems[0x15] = 0;
          local_3f8.data._M_elems[0x16] = 0;
          local_3f8.data._M_elems[0x17] = 0;
          local_3f8.data._M_elems[0x18] = 0;
          local_3f8.data._M_elems[0x19] = 0;
          local_3f8.data._M_elems._104_5_ = 0;
          local_3f8.data._M_elems[0x1b]._1_3_ = 0;
          local_3f8.exp = 0;
          local_3f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_3f8,(double)CONCAT44(uStack_d4,local_d8)
                    );
          if (((pcVar11->fpclass != cpp_dec_float_NaN) && (local_3f8.fpclass != cpp_dec_float_NaN))
             && (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar11,&local_3f8), 0 < iVar3)) {
            local_368.fpclass = cpp_dec_float_finite;
            local_368.prec_elem = 0x1c;
            local_368.data._M_elems[0] = 0;
            local_368.data._M_elems[1] = 0;
            local_368.data._M_elems[2] = 0;
            local_368.data._M_elems[3] = 0;
            local_368.data._M_elems[4] = 0;
            local_368.data._M_elems[5] = 0;
            local_368.data._M_elems[6] = 0;
            local_368.data._M_elems[7] = 0;
            local_368.data._M_elems[8] = 0;
            local_368.data._M_elems[9] = 0;
            local_368.data._M_elems[10] = 0;
            local_368.data._M_elems[0xb] = 0;
            local_368.data._M_elems[0xc] = 0;
            local_368.data._M_elems[0xd] = 0;
            local_368.data._M_elems[0xe] = 0;
            local_368.data._M_elems[0xf] = 0;
            local_368.data._M_elems[0x10] = 0;
            local_368.data._M_elems[0x11] = 0;
            local_368.data._M_elems[0x12] = 0;
            local_368.data._M_elems[0x13] = 0;
            local_368.data._M_elems[0x14] = 0;
            local_368.data._M_elems[0x15] = 0;
            local_368.data._M_elems[0x16] = 0;
            local_368.data._M_elems[0x17] = 0;
            local_368.data._M_elems[0x18] = 0;
            local_368.data._M_elems[0x19] = 0;
            local_368.data._M_elems._104_5_ = 0;
            local_368.data._M_elems[0x1b]._1_3_ = 0;
            local_368.exp = 0;
            local_368.neg = false;
            if (&local_368 == &vec[iVar6].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_368,pcVar11);
              if (local_368.data._M_elems[0] != 0 || local_368.fpclass != cpp_dec_float_finite) {
                local_368.neg = (bool)(local_368.neg ^ 1);
                goto LAB_005c6ed0;
              }
LAB_005c6ee3:
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3f8,0,(type *)0x0);
              iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_368,&local_3f8);
              if (-1 < iVar3) {
                pcVar11 = &local_3f8;
                pnVar9 = v;
                pcVar10 = pcVar11;
                for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                  (pcVar10->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
                  pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)pnVar9 + (ulong)bVar14 * -8 + 4);
                  pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar10 + (ulong)bVar14 * -8 + 4);
                }
                local_3f8.exp =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.exp;
                local_3f8.neg =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.neg;
                local_3f8.fpclass =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.fpclass;
                local_3f8.prec_elem =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.prec_elem;
                if (local_3f8.fpclass != cpp_dec_float_finite || local_3f8.data._M_elems[0] != 0) {
                  local_3f8.neg = (bool)(local_3f8.neg ^ 1);
                  pcVar11 = &local_3f8;
                }
                goto LAB_005c7022;
              }
            }
            else {
              if (&local_368 != pcVar11) {
                pcVar10 = pcVar11;
                pcVar12 = &local_368;
                for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                  (pcVar12->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                  pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar10 + (ulong)bVar14 * -8 + 4);
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar14 * -8 + 4);
                }
                local_368.exp = pcVar11->exp;
                local_368.neg = pcVar11->neg;
                local_368.fpclass = pcVar11->fpclass;
                local_368.prec_elem = pcVar11->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_368,&vec[iVar6].m_backend);
LAB_005c6ed0:
              if (local_368.fpclass != cpp_dec_float_NaN) goto LAB_005c6ee3;
            }
            local_158.fpclass = cpp_dec_float_finite;
            local_158.prec_elem = 0x1c;
            local_158.data._M_elems[0] = 0;
            local_158.data._M_elems[1] = 0;
            local_158.data._M_elems[2] = 0;
            local_158.data._M_elems[3] = 0;
            local_158.data._M_elems[4] = 0;
            local_158.data._M_elems[5] = 0;
            local_158.data._M_elems[6] = 0;
            local_158.data._M_elems[7] = 0;
            local_158.data._M_elems[8] = 0;
            local_158.data._M_elems[9] = 0;
            local_158.data._M_elems[10] = 0;
            local_158.data._M_elems[0xb] = 0;
            local_158.data._M_elems[0xc] = 0;
            local_158.data._M_elems[0xd] = 0;
            local_158.data._M_elems[0xe] = 0;
            local_158.data._M_elems[0xf] = 0;
            local_158.data._M_elems[0x10] = 0;
            local_158.data._M_elems[0x11] = 0;
            local_158.data._M_elems[0x12] = 0;
            local_158.data._M_elems[0x13] = 0;
            local_158.data._M_elems[0x14] = 0;
            local_158.data._M_elems[0x15] = 0;
            local_158.data._M_elems[0x16] = 0;
            local_158.data._M_elems[0x17] = 0;
            local_158.data._M_elems[0x18] = 0;
            local_158.data._M_elems[0x19] = 0;
            local_158.data._M_elems._104_5_ = 0;
            local_158.data._M_elems[0x1b]._1_3_ = 0;
            local_158.exp = 0;
            local_158.neg = false;
            pcVar11 = &local_158;
            if (pcVar11 == &v->m_backend) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (pcVar11,&local_368);
              if (local_158.data._M_elems[0] != 0 || local_158.fpclass != cpp_dec_float_finite) {
                local_158.neg = (bool)(local_158.neg ^ 1);
                pcVar11 = &local_158;
              }
            }
            else {
              pcVar10 = &local_368;
              pcVar12 = pcVar11;
              for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4)
                ;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar14 * -8 + 4)
                ;
              }
              local_158.exp = local_368.exp;
              local_158.neg = local_368.neg;
              local_158.fpclass = local_368.fpclass;
              local_158.prec_elem = local_368.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (pcVar11,&v->m_backend);
            }
            goto LAB_005c7022;
          }
        }
      }
      else {
        iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_1d8,&local_3f8);
        if (iVar3 < 1) {
          local_3f8.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.exp;
          local_3f8.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.neg;
          fVar5 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.fpclass;
          iVar13 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.prec_elem;
          goto LAB_005c6bb2;
        }
        ::soplex::infinity::__tls_init();
        pcVar11 = &upp[iVar6].m_backend;
        local_3f8.fpclass = cpp_dec_float_finite;
        local_3f8.prec_elem = 0x1c;
        local_3f8.data._M_elems[0] = 0;
        local_3f8.data._M_elems[1] = 0;
        local_3f8.data._M_elems[2] = 0;
        local_3f8.data._M_elems[3] = 0;
        local_3f8.data._M_elems[4] = 0;
        local_3f8.data._M_elems[5] = 0;
        local_3f8.data._M_elems[6] = 0;
        local_3f8.data._M_elems[7] = 0;
        local_3f8.data._M_elems[8] = 0;
        local_3f8.data._M_elems[9] = 0;
        local_3f8.data._M_elems[10] = 0;
        local_3f8.data._M_elems[0xb] = 0;
        local_3f8.data._M_elems[0xc] = 0;
        local_3f8.data._M_elems[0xd] = 0;
        local_3f8.data._M_elems[0xe] = 0;
        local_3f8.data._M_elems[0xf] = 0;
        local_3f8.data._M_elems[0x10] = 0;
        local_3f8.data._M_elems[0x11] = 0;
        local_3f8.data._M_elems[0x12] = 0;
        local_3f8.data._M_elems[0x13] = 0;
        local_3f8.data._M_elems[0x14] = 0;
        local_3f8.data._M_elems[0x15] = 0;
        local_3f8.data._M_elems[0x16] = 0;
        local_3f8.data._M_elems[0x17] = 0;
        local_3f8.data._M_elems[0x18] = 0;
        local_3f8.data._M_elems[0x19] = 0;
        local_3f8.data._M_elems._104_5_ = 0;
        local_3f8.data._M_elems[0x1b]._1_3_ = 0;
        local_3f8.exp = 0;
        local_3f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3f8,local_c8);
        if (((pcVar11->fpclass == cpp_dec_float_NaN) || (local_3f8.fpclass == cpp_dec_float_NaN)) ||
           (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar11,&local_3f8), -1 < iVar3)) goto LAB_005c71bf;
        local_368.fpclass = cpp_dec_float_finite;
        local_368.prec_elem = 0x1c;
        local_368.data._M_elems[0] = 0;
        local_368.data._M_elems[1] = 0;
        local_368.data._M_elems[2] = 0;
        local_368.data._M_elems[3] = 0;
        local_368.data._M_elems[4] = 0;
        local_368.data._M_elems[5] = 0;
        local_368.data._M_elems[6] = 0;
        local_368.data._M_elems[7] = 0;
        local_368.data._M_elems[8] = 0;
        local_368.data._M_elems[9] = 0;
        local_368.data._M_elems[10] = 0;
        local_368.data._M_elems[0xb] = 0;
        local_368.data._M_elems[0xc] = 0;
        local_368.data._M_elems[0xd] = 0;
        local_368.data._M_elems[0xe] = 0;
        local_368.data._M_elems[0xf] = 0;
        local_368.data._M_elems[0x10] = 0;
        local_368.data._M_elems[0x11] = 0;
        local_368.data._M_elems[0x12] = 0;
        local_368.data._M_elems[0x13] = 0;
        local_368.data._M_elems[0x14] = 0;
        local_368.data._M_elems[0x15] = 0;
        local_368.data._M_elems[0x16] = 0;
        local_368.data._M_elems[0x17] = 0;
        local_368.data._M_elems[0x18] = 0;
        local_368.data._M_elems[0x19] = 0;
        local_368.data._M_elems._104_5_ = 0;
        local_368.data._M_elems[0x1b]._1_3_ = 0;
        local_368.exp = 0;
        local_368.neg = false;
        if (&local_368 == &vec[iVar6].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_368,pcVar11);
          if (local_368.data._M_elems[0] != 0 || local_368.fpclass != cpp_dec_float_finite) {
            local_368.neg = (bool)(local_368.neg ^ 1);
            goto LAB_005c6de1;
          }
LAB_005c6df0:
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_3f8,0,(type *)0x0);
          iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_368,&local_3f8);
          pcVar11 = &v->m_backend;
          if (0 < iVar3) goto LAB_005c6e1e;
        }
        else {
          if (&local_368 != pcVar11) {
            pcVar10 = pcVar11;
            pcVar12 = &local_368;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar12->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar14 * -8 + 4);
            }
            local_368.exp = pcVar11->exp;
            local_368.neg = pcVar11->neg;
            local_368.fpclass = pcVar11->fpclass;
            local_368.prec_elem = pcVar11->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_368,&vec[iVar6].m_backend);
LAB_005c6de1:
          if (local_368.fpclass != cpp_dec_float_NaN) goto LAB_005c6df0;
LAB_005c6e1e:
          local_3f8.fpclass = cpp_dec_float_finite;
          local_3f8.prec_elem = 0x1c;
          local_3f8.data._M_elems[0] = 0;
          local_3f8.data._M_elems[1] = 0;
          local_3f8.data._M_elems[2] = 0;
          local_3f8.data._M_elems[3] = 0;
          local_3f8.data._M_elems[4] = 0;
          local_3f8.data._M_elems[5] = 0;
          local_3f8.data._M_elems[6] = 0;
          local_3f8.data._M_elems[7] = 0;
          local_3f8.data._M_elems[8] = 0;
          local_3f8.data._M_elems[9] = 0;
          local_3f8.data._M_elems[10] = 0;
          local_3f8.data._M_elems[0xb] = 0;
          local_3f8.data._M_elems[0xc] = 0;
          local_3f8.data._M_elems[0xd] = 0;
          local_3f8.data._M_elems[0xe] = 0;
          local_3f8.data._M_elems[0xf] = 0;
          local_3f8.data._M_elems[0x10] = 0;
          local_3f8.data._M_elems[0x11] = 0;
          local_3f8.data._M_elems[0x12] = 0;
          local_3f8.data._M_elems[0x13] = 0;
          local_3f8.data._M_elems[0x14] = 0;
          local_3f8.data._M_elems[0x15] = 0;
          local_3f8.data._M_elems[0x16] = 0;
          local_3f8.data._M_elems[0x17] = 0;
          local_3f8.data._M_elems[0x18] = 0;
          local_3f8.data._M_elems[0x19] = 0;
          local_3f8.data._M_elems._104_5_ = 0;
          local_3f8.data._M_elems[0x1b]._1_3_ = 0;
          local_3f8.exp = 0;
          local_3f8.neg = false;
          pcVar11 = &local_3f8;
          pcVar10 = &local_368;
          if (pcVar11 != &v->m_backend) {
            pcVar12 = pcVar11;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar12->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar14 * -8 + 4);
            }
            local_3f8.exp = local_368.exp;
            local_3f8.neg = local_368.neg;
            local_3f8.fpclass = local_368.fpclass;
            local_3f8.prec_elem = local_368.prec_elem;
            pcVar10 = &v->m_backend;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (pcVar11,pcVar10);
        }
LAB_005c7022:
        local_258.fpclass = cpp_dec_float_finite;
        local_258.prec_elem = 0x1c;
        local_258.data._M_elems[0] = 0;
        local_258.data._M_elems[1] = 0;
        local_258.data._M_elems[2] = 0;
        local_258.data._M_elems[3] = 0;
        local_258.data._M_elems[4] = 0;
        local_258.data._M_elems[5] = 0;
        local_258.data._M_elems[6] = 0;
        local_258.data._M_elems[7] = 0;
        local_258.data._M_elems[8] = 0;
        local_258.data._M_elems[9] = 0;
        local_258.data._M_elems[10] = 0;
        local_258.data._M_elems[0xb] = 0;
        local_258.data._M_elems[0xc] = 0;
        local_258.data._M_elems[0xd] = 0;
        local_258.data._M_elems[0xe] = 0;
        local_258.data._M_elems[0xf] = 0;
        local_258.data._M_elems[0x10] = 0;
        local_258.data._M_elems[0x11] = 0;
        local_258.data._M_elems[0x12] = 0;
        local_258.data._M_elems[0x13] = 0;
        local_258.data._M_elems[0x14] = 0;
        local_258.data._M_elems[0x15] = 0;
        local_258.data._M_elems[0x16] = 0;
        local_258.data._M_elems[0x17] = 0;
        local_258.data._M_elems[0x18] = 0;
        local_258.data._M_elems[0x19] = 0;
        local_258.data._M_elems._104_5_ = 0;
        local_258.data._M_elems[0x1b]._1_3_ = 0;
        local_258.exp = 0;
        local_258.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_258,pcVar11,&local_1d8);
        pcVar11 = &local_258;
        pcVar10 = &local_2d8;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pcVar10->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
        }
        local_2d8.exp = local_258.exp;
        local_2d8.neg = local_258.neg;
        local_2d8.fpclass = local_258.fpclass;
        local_2d8.prec_elem = local_258.prec_elem;
        pBVar1 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar1[*nBp].idx = iVar6;
        iVar6 = *nBp;
        pBVar1[iVar6].src = src;
        pcVar11 = &local_2d8;
        pBVar8 = pBVar1 + iVar6;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(uint *)&(pBVar8->val).m_backend = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
          pBVar8 = (pointer)((long)pBVar8 + ((ulong)bVar14 * -2 + 1) * 4);
        }
        *(int *)((long)&pBVar1[iVar6].val.m_backend + 0x70) = local_258.exp;
        *(bool *)((long)&pBVar1[iVar6].val.m_backend + 0x74) = local_258.neg;
        *(undefined8 *)((long)&pBVar1[iVar6].val.m_backend + 0x78) = local_258._120_8_;
        if ((local_258.fpclass == cpp_dec_float_NaN) || (local_b0.fpclass == cpp_dec_float_NaN)) {
          iVar6 = *nBp;
        }
        else {
          iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2d8,&local_b0);
          iVar6 = *nBp;
          if (iVar3 < 0) {
            pcVar11 = &local_2d8;
            pcVar10 = &local_b0;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar10->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
            }
            local_b0.exp = local_2d8.exp;
            local_b0.neg = local_2d8.neg;
            local_b0.fpclass = local_2d8.fpclass;
            local_b0.prec_elem = local_2d8.prec_elem;
            *local_378 = iVar6;
          }
        }
        *nBp = iVar6 + 1;
      }
LAB_005c71bf:
      iVar6 = *nBp;
      iVar3 = (int)((ulong)((long)(this->breakpoints).data.
                                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (SBORROW4(iVar6,iVar3 * -0xf0f0f0f) == iVar6 + iVar3 * 0xf0f0f0f < 0) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&(this->breakpoints).data,(long)iVar6 * 2);
      }
      idx = idx + 1;
    } while (idx < local_2e0);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}